

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__paeth(int a,int b,int c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int pc;
  int pb;
  int pa;
  int p;
  int c_local;
  int b_local;
  int a_local;
  
  iVar1 = (a + b) - c;
  iVar2 = iVar1 - a;
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  iVar3 = iVar1 - b;
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  iVar1 = iVar1 - c;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  if (((iVar3 < iVar2) || (b_local = a, iVar1 < iVar2)) && (b_local = c, iVar3 <= iVar1)) {
    b_local = b;
  }
  return b_local;
}

Assistant:

static int stbi__paeth(int a, int b, int c)
{
   int p = a + b - c;
   int pa = abs(p-a);
   int pb = abs(p-b);
   int pc = abs(p-c);
   if (pa <= pb && pa <= pc) return a;
   if (pb <= pc) return b;
   return c;
}